

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

void cppcms_capi_session_pool_delete(cppcms_capi_session_pool *pool)

{
  if (pool != (cppcms_capi_session_pool *)0x0) {
    cppcms_capi_session_pool::~cppcms_capi_session_pool(pool);
    operator_delete(pool);
    return;
  }
  return;
}

Assistant:

void cppcms_capi_session_pool_delete(cppcms_capi_session_pool *pool)
{
	if(pool)
		delete pool;
}